

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

bool __thiscall
jrtplib::RTPUDPv4Transmitter::ComesFromThisTransmitter(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  bool bVar1;
  _List_node_base *p_Var2;
  
  if ((((addr != (RTPAddress *)0x0) && (this->init != false)) && (this->created == true)) &&
     (addr->addresstype == IPv4Address)) {
    p_Var2 = (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    if (p_Var2 != (_List_node_base *)&this->localIPs) {
      bVar1 = false;
      do {
        if (*(int *)&addr->field_0xc == *(int *)&p_Var2[1]._M_next) {
          bVar1 = true;
        }
        else {
          p_Var2 = p_Var2->_M_next;
        }
        if (bVar1) goto LAB_00120f23;
      } while (p_Var2 != (_List_node_base *)&this->localIPs);
      if (bVar1) {
LAB_00120f23:
        if (*(uint16_t *)&addr[1]._vptr_RTPAddress != this->m_rtpPort) {
          return *(uint16_t *)&addr[1]._vptr_RTPAddress == this->m_rtcpPort;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool RTPUDPv4Transmitter::ComesFromThisTransmitter(const RTPAddress *addr)
{
	if (!init)
		return false;

	if (addr == 0)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (created && addr->GetAddressType() == RTPAddress::IPv4Address)
	{	
		const RTPIPv4Address *addr2 = (const RTPIPv4Address *)addr;
		bool found = false;
		std::list<uint32_t>::const_iterator it;
	
		it = localIPs.begin();
		while (!found && it != localIPs.end())
		{
			if (addr2->GetIP() == *it)
				found = true;
			else
				++it;
		}
	
		if (!found)
			v = false;
		else
		{
			if (addr2->GetPort() == m_rtpPort || addr2->GetPort() == m_rtcpPort) // check for RTP port and RTCP port
				v = true;
			else 
				v = false;
		}
	}
	else
		v = false;

	MAINMUTEX_UNLOCK
	return v;
}